

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_775ed::FileSystemRootNode::touch(FileSystemRootNode *this,string *filename)

{
  int iVar1;
  ostream *poVar2;
  string local_40;
  
  iVar1 = utimensat(-100,(filename->_M_dataplus)._M_p,(timespec *)0x0,0);
  if (iVar1 != 0) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"FileSystem","");
    poVar2 = GEO::Logger::err(&local_40);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Could not touch file:",0x15);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(filename->_M_dataplus)._M_p,filename->_M_string_length);
    std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  return iVar1 == 0;
}

Assistant:

bool touch(const std::string& filename) override {
#ifdef GEO_OS_APPLE
           {
                struct stat buff;
                int rc = stat(filename.c_str(), &buff); 
                if(rc != 0) {  // FABIEN NOT SURE WE GET THE TOUCH
                    Logger::err("FileSystem")
                        << "Could not touch file:"
                        << filename
                        << std::endl;
		    return false;
                }
		return true;
            }
#else
            {
                int rc = utimensat(
                    AT_FDCWD,
                    filename.c_str(),
                    nullptr,
                    0
                );
                if(rc != 0) {
                    Logger::err("FileSystem")
                        << "Could not touch file:"
                        << filename
                        << std::endl;
		    return false;
                }
		return true;
            }
#endif	    
        }